

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O0

bool is_invalid(char *s)

{
  int iVar1;
  bool valid;
  char *s_local;
  
  iVar1 = cm_utf8_is_valid(s);
  if (iVar1 == 0) {
    report_invalid(true,s);
    printf("invalid as expected\n");
  }
  else {
    report_invalid(false,s);
    printf("expected invalid, reported as valid\n");
  }
  return iVar1 == 0;
}

Assistant:

static bool is_invalid(const char* s)
{
  bool valid = cm_utf8_is_valid(s) != 0;
  if (valid) {
    report_invalid(false, s);
    printf("expected invalid, reported as valid\n");
    return false;
  }
  report_invalid(true, s);
  printf("invalid as expected\n");
  return true;
}